

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O2

void anon_unknown.dwarf_10c9768::sync(void)

{
  int in_EDX;
  int iVar1;
  int iVar2;
  int in_ESI;
  PCMSegment *in_RDI;
  vector<bool,_std::allocator<bool>_> *this;
  bool bVar3;
  
  Storage::Disk::PCMSegment::PCMSegment(in_RDI);
  this = &in_RDI->data;
  std::vector<bool,_std::allocator<bool>_>::reserve(this,(long)(in_EDX * in_ESI));
  while (bVar3 = in_ESI != 0, in_ESI = in_ESI + -1, bVar3) {
    iVar1 = -9;
    while (iVar1 = iVar1 + 1, iVar2 = in_EDX + -7, iVar1 != 0) {
      std::vector<bool,_std::allocator<bool>_>::push_back(this,true);
    }
    while (iVar2 + -1 != 0) {
      std::vector<bool,_std::allocator<bool>_>::push_back(this,false);
      iVar2 = iVar2 + -1;
    }
  }
  return;
}

Assistant:

Storage::Disk::PCMSegment sync(int length, int bit_size) {
	Storage::Disk::PCMSegment segment;

	// Reserve sufficient storage.
	segment.data.reserve(size_t(length * bit_size));

	// Write patterns of 0xff padded with 0s to the selected bit size.
	while(length--) {
		int c = 8;
		while(c--)
			segment.data.push_back(true);

		c = bit_size - 8;
		while(c--)
			segment.data.push_back(false);
	}

	return segment;
}